

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsStatus __thiscall HEkk::dualize(HEkk *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *__x;
  vector<int,_std::allocator<int>_> *__x_00;
  undefined4 uVar2;
  undefined4 uVar6;
  vector<int,std::allocator<int>> *pvVar3;
  vector<int,std::allocator<int>> *pvVar4;
  double dVar5;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar17;
  iterator iVar10;
  iterator iVar11;
  pointer piVar12;
  pointer piVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pdVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  HighsSparseMatrix *this_00;
  HighsInt HVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  bool bVar34;
  double dVar35;
  vector<double,std::allocator<double>> *pvVar36;
  double one;
  double row_lower;
  double row_upper;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> primal_bound_index;
  vector<double,_std::allocator<double>_> primal_bound_value;
  HighsSparseMatrix extra_columns;
  HighsInt dummy_row;
  undefined8 local_2b0;
  vector<double,_std::allocator<double>_> local_2a8;
  vector<int,_std::allocator<int>_> local_288;
  vector<double,std::allocator<double>> *local_268;
  vector<int,std::allocator<int>> *local_260;
  vector<double,_std::allocator<double>_> *local_258;
  vector<double,std::allocator<double>> *local_250;
  vector<double,std::allocator<double>> *local_248;
  double local_240;
  undefined1 local_238 [16];
  int *local_228;
  vector<double,_std::allocator<double>_> *local_220;
  undefined1 local_218 [16];
  double *local_208;
  vector<int,std::allocator<int>> *local_1f8;
  undefined8 uStack_1f0;
  double local_1e0;
  HighsSparseMatrix local_1d8;
  vector<int,std::allocator<int>> *local_168;
  undefined8 uStack_160;
  vector<int,std::allocator<int>> *local_158;
  vector<double,_std::allocator<double>_> *local_150;
  vector<int,_std::allocator<int>_> *local_148;
  vector<int,_std::allocator<int>_> *local_140;
  vector<int,_std::allocator<int>_> *local_138;
  HighsSparseMatrix *local_130;
  vector<double,std::allocator<double>> *local_128;
  vector<double,std::allocator<double>> *local_120;
  uint local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  HighsInt local_108;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<int,std::allocator<int>> *local_a0;
  HighsInt local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  HVar24 = (this->lp_).num_row_;
  this->original_num_col_ = (this->lp_).num_col_;
  this->original_num_row_ = HVar24;
  local_130 = &(this->lp_).a_matrix_;
  HVar24 = HighsSparseMatrix::numNz(local_130);
  this->original_num_nz_ = HVar24;
  this->original_offset_ = (this->lp_).offset_;
  local_268 = (vector<double,std::allocator<double>> *)&(this->lp_).col_cost_;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->original_col_cost_,(vector<double,_std::allocator<double>_> *)local_268);
  local_248 = (vector<double,std::allocator<double>> *)&(this->lp_).col_lower_;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->original_col_lower_,(vector<double,_std::allocator<double>_> *)local_248);
  local_250 = (vector<double,std::allocator<double>> *)&(this->lp_).col_upper_;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->original_col_upper_,(vector<double,_std::allocator<double>_> *)local_250);
  pvVar1 = &(this->lp_).row_lower_;
  local_258 = &this->original_row_lower_;
  std::vector<double,_std::allocator<double>_>::operator=(local_258,pvVar1);
  __x = &(this->lp_).row_upper_;
  local_220 = &this->original_row_upper_;
  std::vector<double,_std::allocator<double>_>::operator=(local_220,__x);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_268,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_248,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_250,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)this->original_num_col_);
  std::vector<double,_std::allocator<double>_>::reserve(__x,(long)this->original_num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_268,0);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_248,0);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_250,0);
  local_120 = (vector<double,std::allocator<double>> *)pvVar1;
  std::vector<double,_std::allocator<double>_>::resize(pvVar1,0);
  local_128 = (vector<double,std::allocator<double>> *)__x;
  std::vector<double,_std::allocator<double>_>::resize(__x,0);
  local_108 = (this->lp_).a_matrix_.num_row_;
  uVar9 = (this->lp_).a_matrix_.format_;
  uVar17 = (this->lp_).a_matrix_.num_col_;
  local_138 = &(this->lp_).a_matrix_.start_;
  local_110 = uVar9;
  uStack_10c = uVar17;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,local_138);
  __x_00 = &(this->lp_).a_matrix_.p_end_;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__x_00);
  local_148 = &(this->lp_).a_matrix_.index_;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,local_148);
  local_150 = &(this->lp_).a_matrix_.value_;
  local_140 = __x_00;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,local_150);
  uVar2 = this->original_num_col_;
  uVar6 = this->original_num_row_;
  local_110 = 2;
  local_208 = (double *)0x0;
  local_218 = (undefined1  [16])0x0;
  local_228 = (int *)0x0;
  local_238 = (undefined1  [16])0x0;
  local_2b0._0_4_ = 0;
  uStack_10c = uVar6;
  local_108 = uVar2;
  if (0 < this->original_num_col_) {
    local_158 = (vector<int,std::allocator<int>> *)&this->upper_bound_col_;
    do {
      lVar26 = (long)(int)local_2b0;
      pvVar3 = (vector<int,std::allocator<int>> *)
               (this->original_col_lower_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar26];
      pvVar4 = (vector<int,std::allocator<int>> *)
               (this->original_col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar26];
      local_1d8._0_8_ = INFINITY;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_7ff0000000000000;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      if (((double)pvVar3 != (double)pvVar4) || (NAN((double)pvVar3) || NAN((double)pvVar4))) {
        uStack_160 = 0;
        local_260 = pvVar4;
        local_1f8 = (vector<int,std::allocator<int>> *)
                    (this->original_col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar26];
        local_168 = pvVar3;
        bVar34 = highs_isInfinity(-(double)pvVar3);
        if (bVar34) {
          bVar34 = highs_isInfinity((double)local_260);
          if (!bVar34) {
            local_1d8._0_8_ = local_260;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1f8;
            goto LAB_003406f8;
          }
          local_1d8._0_8_ = (vector<int,std::allocator<int>> *)0x0;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1f8;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)local_1f8;
        }
        else {
          bVar34 = highs_isInfinity((double)local_260);
          local_1d8._0_8_ = local_168;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)local_1f8;
          if (!bVar34) {
            iVar11._M_current =
                 (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_158,iVar11,(int *)&local_2b0);
            }
            else {
              *iVar11._M_current = (int)local_2b0;
              (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar11._M_current + 1;
            }
          }
        }
      }
      else {
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
        local_1d8._0_8_ = pvVar3;
LAB_003406f8:
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x7ff0000000000000;
      }
      iVar10._M_current =
           (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_120,iVar10,(double *)&local_2a8);
      }
      else {
        *iVar10._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      iVar10._M_current =
           (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_128,iVar10,(double *)&local_288);
      }
      else {
        *iVar10._M_current =
             (double)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      if (((double)local_1d8._0_8_ != 0.0) || (NAN((double)local_1d8._0_8_))) {
        if ((double *)local_218._8_8_ == local_208) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)local_218,(iterator)local_218._8_8_,
                     (double *)&local_1d8);
        }
        else {
          *(undefined8 *)local_218._8_8_ = local_1d8._0_8_;
          local_218._8_8_ = (double *)(local_218._8_8_ + 8);
        }
        if ((int *)local_238._8_8_ == local_228) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_238,(iterator)local_238._8_8_,
                     (int *)&local_2b0);
        }
        else {
          *(int *)local_238._8_8_ = (int)local_2b0;
          local_238._8_8_ = (int *)(local_238._8_8_ + 4);
        }
      }
      local_2b0._0_4_ = (int)local_2b0 + 1;
    } while ((int)local_2b0 < this->original_num_col_);
  }
  local_2b0 = (double)((ulong)local_2b0._4_4_ << 0x20);
  if (0 < this->original_num_row_) {
    local_168 = (vector<int,std::allocator<int>> *)&this->upper_bound_row_;
    iVar25 = 0;
    do {
      pvVar3 = (vector<int,std::allocator<int>> *)
               (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar25];
      pvVar4 = (vector<int,std::allocator<int>> *)
               (local_220->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar25];
      local_1d8._0_8_ = INFINITY;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_7ff0000000000000;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      if (((double)pvVar3 != (double)pvVar4) || (NAN((double)pvVar3) || NAN((double)pvVar4))) {
        uStack_1f0 = 0;
        local_260 = pvVar4;
        local_1f8 = pvVar3;
        bVar34 = highs_isInfinity(-(double)pvVar3);
        if (bVar34) {
          bVar34 = highs_isInfinity((double)local_260);
          if (bVar34) {
            local_1d8._0_8_ = (vector<int,std::allocator<int>> *)0x0;
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._0_16_ = auVar18 << 0x40;
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _0_16_ = auVar19 << 0x40;
          }
          else {
            local_1d8._0_8_ = local_260;
            local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _0_16_ = auVar22 << 0x40;
          }
        }
        else {
          bVar34 = highs_isInfinity((double)local_260);
          local_1d8._0_8_ = local_1f8;
          auVar21._8_8_ = 0;
          auVar21._0_8_ =
               local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar21 << 0x40;
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x7ff0000000000000;
          if (!bVar34) {
            iVar11._M_current =
                 (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_168,iVar11,(int *)&local_2b0);
            }
            else {
              *iVar11._M_current = (int)local_2b0;
              (this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar11._M_current + 1;
            }
          }
        }
      }
      else {
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x7ff0000000000000;
        local_1d8._0_8_ = pvVar3;
      }
      iVar10._M_current =
           (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_268,iVar10,(double *)&local_1d8);
      }
      else {
        *iVar10._M_current = (double)local_1d8._0_8_;
        (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      iVar10._M_current =
           (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_248,iVar10,(double *)&local_2a8);
      }
      else {
        *iVar10._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      iVar10._M_current =
           (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_250,iVar10,(double *)&local_288);
      }
      else {
        *iVar10._M_current =
             (double)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      iVar25 = (int)local_2b0 + 1;
      local_2b0 = (double)CONCAT44(local_2b0._4_4_,iVar25);
    } while (iVar25 < this->original_num_row_);
  }
  HighsSparseMatrix::HighsSparseMatrix(&local_1d8);
  HighsSparseMatrix::ensureColwise(&local_1d8);
  local_1d8.num_row_ = this->original_num_col_;
  local_220 = (vector<double,_std::allocator<double>_> *)
              ((long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  local_258 = (vector<double,_std::allocator<double>_> *)
              ((ulong)((long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_2b0 = 1.0;
  uVar27 = (uint)local_258;
  if (0 < (int)uVar27) {
    uVar30 = 0;
    do {
      iVar25 = (this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar30];
      local_240 = (double)CONCAT44(local_240._4_4_,iVar25);
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(this->original_col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar25];
      HighsSparseMatrix::addVec(&local_1d8,1,(HighsInt *)&local_240,(double *)&local_2b0,1.0);
      iVar10._M_current =
           (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_268,iVar10,(double *)&local_2a8);
      }
      else {
        *iVar10._M_current =
             (double)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&DAT_fff0000000000000;
      iVar10._M_current =
           (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_248,iVar10,(double *)&local_288)
        ;
      }
      else {
        *iVar10._M_current = -INFINITY;
        (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_
           = auVar23 << 0x40;
      iVar10._M_current =
           (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_250,iVar10,(double *)&local_288)
        ;
      }
      else {
        *iVar10._M_current = 0.0;
        (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      uVar30 = uVar30 + 1;
    } while ((uVar27 & 0x7fffffff) != uVar30);
  }
  pvVar1 = local_220;
  uVar30 = (ulong)local_220 >> 2;
  uVar27 = (uint)uVar30;
  if (uVar27 != 0) {
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_114 = uVar27;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&local_2a8,(long)this->original_num_row_,
               (value_type_conflict2 *)&local_114);
    local_240 = (double)((ulong)local_240 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_288,(long)pvVar1 * 0x40000000 + 0x100000000 >> 0x20,
               (value_type_conflict2 *)&local_240);
    if (0 < (int)uVar27) {
      uVar32 = 0;
      do {
        lVar26 = (long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar32];
        *(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar26 * 4) = (int)uVar32;
        local_240 = (this->original_row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar26];
        iVar10._M_current =
             (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_268,iVar10,&local_240);
        }
        else {
          *iVar10._M_current = local_240;
          (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
        local_1e0 = -INFINITY;
        iVar10._M_current =
             (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_248,iVar10,&local_1e0);
        }
        else {
          *iVar10._M_current = -INFINITY;
          (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
        local_1e0 = 0.0;
        iVar10._M_current =
             (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_250,iVar10,&local_1e0);
        }
        else {
          *iVar10._M_current = 0.0;
          (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
        uVar32 = uVar32 + 1;
      } while ((uVar27 & 0x7fffffff) != uVar32);
    }
    if (0 < this->original_num_nz_) {
      piVar12 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar26 = 0;
      do {
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start + (long)piVar12[lVar26] * 4
                         )] =
             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[*(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                               (long)piVar12[lVar26] * 4)] + 1;
        lVar26 = lVar26 + 1;
      } while (lVar26 < this->original_num_nz_);
    }
    iVar25 = (int)local_258;
    std::vector<int,_std::allocator<int>_>::resize
              (&local_1d8.start_,(long)(int)(uVar27 + iVar25 + 1));
    if (0 < (int)uVar27) {
      uVar32 = 0;
      do {
        local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)iVar25 + uVar32 + 1] =
             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar32] +
             local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar25 + uVar32];
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar32] =
             local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar25 + uVar32];
        uVar32 = uVar32 + 1;
      } while ((uVar27 & 0x7fffffff) != uVar32);
    }
    iVar25 = local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)(uVar27 + iVar25)];
    std::vector<int,_std::allocator<int>_>::resize(&local_1d8.index_,(long)iVar25);
    std::vector<double,_std::allocator<double>_>::resize(&local_1d8.value_,(long)iVar25);
    if (0 < this->original_num_col_) {
      piVar12 = (this->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar26 = 0;
      do {
        lVar29 = (long)piVar12[lVar26];
        lVar28 = lVar26 + 1;
        if (piVar12[lVar26] < piVar12[lVar26 + 1]) {
          pdVar14 = (this->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar25 = *(int *)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                             (long)piVar13[lVar29] * 4);
            if (iVar25 < (int)uVar27) {
              iVar7 = local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar25];
              local_1d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7] = (int)lVar26;
              local_1d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7] = pdVar14[lVar29];
              local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar25] =
                   local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar25] + 1;
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 < piVar12[lVar28]);
        }
        lVar26 = lVar28;
      } while (lVar28 < this->original_num_col_);
    }
    local_1d8.num_col_ = local_1d8.num_col_ + uVar27;
    if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  this_00 = local_130;
  if (local_238._8_8_ - local_238._0_8_ == 0) {
    pvVar36 = (vector<double,std::allocator<double>> *)0x0;
  }
  else {
    lVar26 = (long)(local_238._8_8_ - local_238._0_8_) >> 2;
    pdVar14 = (this->original_col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    pdVar15 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (this->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar16 = (this->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar13 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar36 = (vector<double,std::allocator<double>> *)0x0;
    lVar28 = 0;
    do {
      lVar29 = (long)*(int *)(local_238._0_8_ + lVar28 * 4);
      dVar35 = *(double *)(local_218._0_8_ + lVar28 * 8);
      dVar5 = pdVar14[lVar29];
      iVar25 = piVar12[lVar29];
      lVar33 = (long)iVar25;
      iVar7 = piVar12[lVar29 + 1];
      if (iVar25 < iVar7) {
        do {
          iVar25 = piVar13[lVar33];
          pdVar15[iVar25] = pdVar16[lVar33] * -dVar35 + pdVar15[iVar25];
          lVar33 = lVar33 + 1;
        } while (iVar7 != lVar33);
      }
      pvVar36 = (vector<double,std::allocator<double>> *)((double)pvVar36 + dVar5 * dVar35);
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar26 + (ulong)(lVar26 == 0));
  }
  if (local_1d8.num_col_ != 0) {
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _0_16_ = ZEXT816(0);
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
         auVar20 << 0x40;
    local_268 = pvVar36;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_2a8,(long)this->original_num_col_,(value_type_conflict1 *)&local_288);
    if (local_238._8_8_ - local_238._0_8_ != 0) {
      lVar26 = (long)(local_238._8_8_ - local_238._0_8_) >> 2;
      lVar28 = 0;
      do {
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[*(int *)(local_238._0_8_ + lVar28 * 4)] =
             *(double *)(local_218._0_8_ + lVar28 * 8);
        lVar28 = lVar28 + 1;
      } while (lVar26 + (ulong)(lVar26 == 0) != lVar28);
    }
    if (0 < (long)local_1d8.num_col_) {
      iVar25 = this->original_num_row_;
      pdVar14 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar26 = 0;
      do {
        dVar35 = pdVar14[iVar25 + lVar26];
        lVar28 = (long)local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26];
        if (local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar26] <
            local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar26 + 1]) {
          do {
            dVar35 = dVar35 - local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [local_1d8.index_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar28]] *
                              local_1d8.value_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar28];
            lVar28 = lVar28 + 1;
          } while (local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar26 + 1] != lVar28);
        }
        pdVar14[iVar25 + lVar26] = dVar35;
        lVar26 = lVar26 + 1;
      } while (lVar26 != local_1d8.num_col_);
    }
    pvVar36 = local_268;
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar36 = local_268;
    }
  }
  (this->lp_).offset_ = (double)pvVar36 + (this->lp_).offset_;
  this_00->num_row_ = local_108;
  this_00->format_ = local_110;
  this_00->num_col_ = uStack_10c;
  std::vector<int,_std::allocator<int>_>::operator=(local_138,&local_100);
  std::vector<int,_std::allocator<int>_>::operator=(local_140,&local_e8);
  std::vector<int,_std::allocator<int>_>::operator=(local_148,&local_d0);
  std::vector<double,_std::allocator<double>_>::operator=(local_150,&local_b8);
  HighsSparseMatrix::ensureColwise(this_00);
  local_98 = local_1d8.num_row_;
  local_a0 = (vector<int,std::allocator<int>> *)local_1d8._0_8_;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,&local_1d8.start_);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,&local_1d8.p_end_);
  pvVar1 = local_258;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_1d8.index_);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_1d8.value_);
  HighsSparseMatrix::addCols(this_00,(HighsSparseMatrix *)&local_a0,(int8_t *)0x0);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar25 = (int)pvVar1;
  uVar31 = uVar27 + iVar25 + this->original_num_row_;
  bVar34 = (this->lp_).sense_ != kMinimize;
  uVar8 = this->original_num_col_;
  (this->lp_).sense_ = (bVar34 - 1) + (uint)bVar34;
  (this->lp_).num_col_ = uVar31;
  (this->lp_).num_row_ = uVar8;
  (this->status_).is_dualized = true;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
               "Solving dual LP with %d columns",(ulong)uVar31);
  if (uVar27 + iVar25 != 0) {
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," [%d extra from",
                 (ulong)(uVar31 - this->original_num_row_));
    if ((iVar25 != 0) &&
       (highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                     " %d boxed variable(s)",(ulong)pvVar1 & 0xffffffff), uVar27 != 0)) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and");
    }
    if (uVar27 != 0) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                   " %d boxed constraint(s)",uVar30 & 0xffffffff);
    }
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"]");
  }
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and %d rows\n",
               (ulong)uVar8);
  if (local_1d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1d8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1d8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1d8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)local_238._0_8_ != (void *)0x0) {
    operator_delete((void *)local_238._0_8_);
  }
  if ((void *)local_218._0_8_ != (void *)0x0) {
    operator_delete((void *)local_218._0_8_);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus HEkk::dualize() {
  assert(lp_.a_matrix_.isColwise());
  original_num_col_ = lp_.num_col_;
  original_num_row_ = lp_.num_row_;
  original_num_nz_ = lp_.a_matrix_.numNz();
  original_offset_ = lp_.offset_;
  original_col_cost_ = lp_.col_cost_;
  original_col_lower_ = lp_.col_lower_;
  original_col_upper_ = lp_.col_upper_;
  original_row_lower_ = lp_.row_lower_;
  original_row_upper_ = lp_.row_upper_;
  // Reserve space for simple dual
  lp_.col_cost_.reserve(original_num_row_);
  lp_.col_lower_.reserve(original_num_row_);
  lp_.col_upper_.reserve(original_num_row_);
  lp_.row_lower_.reserve(original_num_col_);
  lp_.row_upper_.reserve(original_num_col_);
  // Invalidate the original data
  lp_.col_cost_.resize(0);
  lp_.col_lower_.resize(0);
  lp_.col_upper_.resize(0);
  lp_.row_lower_.resize(0);
  lp_.row_upper_.resize(0);
  // The bulk of the constraint matrix of the dual LP is the transpose
  // of the primal constraint matrix. This is obtained row-wise by
  // copying the matrix and flipping the dimensions
  HighsSparseMatrix dual_matrix = lp_.a_matrix_;
  dual_matrix.num_row_ = original_num_col_;
  dual_matrix.num_col_ = original_num_row_;
  dual_matrix.format_ = MatrixFormat::kRowwise;
  // The primal_bound_value vector accumulates the values of the
  // finite bounds on variables - or zero for a free variable - used
  // later to compute the offset and shift for the costs. Many of
  // these components will be zero - all for the case x>=0 - so
  // maintain a list of the nonzeros and corresponding indices. Don't
  // reserve space since they may not be needed
  vector<double> primal_bound_value;
  vector<HighsInt> primal_bound_index;
  const double inf = kHighsInf;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double cost = original_col_cost_[iCol];
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    double primal_bound = inf;
    double row_lower = inf;
    double row_upper = -inf;
    if (lower == upper) {
      // Fixed
      primal_bound = lower;
      // Dual activity a^Ty is free, implying dual for primal column
      // (slack for dual row) is free
      row_lower = -inf;
      row_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
        // Treat upper bound as additional constraint
        upper_bound_col_.push_back(iCol);
      } else {
        // Lower (since upper bound is infinite)
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      primal_bound = upper;
      // Dual activity a^Ty is bounded below by cost, implying dual
      // for primal column (slack for dual row) is non-positive
      row_lower = cost;
      row_upper = inf;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      primal_bound = 0;
      row_lower = cost;
      row_upper = cost;
    }
    assert(row_lower < inf);
    assert(row_upper > -inf);
    assert(primal_bound < inf);
    lp_.row_lower_.push_back(row_lower);
    lp_.row_upper_.push_back(row_upper);
    if (primal_bound) {
      primal_bound_value.push_back(primal_bound);
      primal_bound_index.push_back(iCol);
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    double col_cost = inf;
    double col_lower = inf;
    double col_upper = -inf;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      col_cost = lower;
      col_lower = -inf;
      col_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
        // Treat upper bound as additional constraint
        upper_bound_row_.push_back(iRow);
      } else {
        // Lower (since upper bound is infinite)
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      col_cost = upper;
      col_lower = -inf;
      col_upper = 0;
    } else {
      // FREE
      // Shouldn't get free rows, but handle them anyway
      col_cost = 0;
      col_lower = 0;
      col_upper = 0;
    }
    assert(col_lower < inf);
    assert(col_upper > -inf);
    assert(col_cost < inf);
    lp_.col_cost_.push_back(col_cost);
    lp_.col_lower_.push_back(col_lower);
    lp_.col_upper_.push_back(col_upper);
  }
  vector<HighsInt>& start = lp_.a_matrix_.start_;
  vector<HighsInt>& index = lp_.a_matrix_.index_;
  vector<double>& value = lp_.a_matrix_.value_;
  // Boxed variables and constraints yield extra columns in the dual LP
  HighsSparseMatrix extra_columns;
  extra_columns.ensureColwise();
  extra_columns.num_row_ = original_num_col_;
  HighsInt num_upper_bound_col = upper_bound_col_.size();
  HighsInt num_upper_bound_row = upper_bound_row_.size();
  double one = 1;
  for (HighsInt iX = 0; iX < num_upper_bound_col; iX++) {
    HighsInt iCol = upper_bound_col_[iX];
    const double upper = original_col_upper_[iCol];
    extra_columns.addVec(1, &iCol, &one);
    lp_.col_cost_.push_back(upper);
    lp_.col_lower_.push_back(-inf);
    lp_.col_upper_.push_back(0);
  }

  if (num_upper_bound_row) {
    // Need to identify the submatrix of constraint matrix rows
    // corresponding to those with a row index in
    // upper_bound_row_. When identifying numbers of entries in each
    // row of submatrix, use indirection to get corresponding row
    // index, with a dummy row for rows not in the submatrix.
    HighsInt dummy_row = num_upper_bound_row;
    vector<HighsInt> indirection;
    vector<HighsInt> count;
    indirection.assign(original_num_row_, dummy_row);
    count.assign(num_upper_bound_row + 1, 0);
    HighsInt extra_iRow = 0;
    for (HighsInt iX = 0; iX < num_upper_bound_row; iX++) {
      HighsInt iRow = upper_bound_row_[iX];
      indirection[iRow] = extra_iRow++;
      double upper = original_row_upper_[iRow];
      lp_.col_cost_.push_back(upper);
      lp_.col_lower_.push_back(-inf);
      lp_.col_upper_.push_back(0);
    }
    for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++)
      count[indirection[index[iEl]]]++;
    extra_columns.start_.resize(num_upper_bound_col + num_upper_bound_row + 1);
    for (HighsInt iRow = 0; iRow < num_upper_bound_row; iRow++) {
      extra_columns.start_[num_upper_bound_col + iRow + 1] =
          extra_columns.start_[num_upper_bound_col + iRow] + count[iRow];
      count[iRow] = extra_columns.start_[num_upper_bound_col + iRow];
    }
    HighsInt extra_columns_num_nz =
        extra_columns.start_[num_upper_bound_col + num_upper_bound_row];
    extra_columns.index_.resize(extra_columns_num_nz);
    extra_columns.value_.resize(extra_columns_num_nz);
    for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
      for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++) {
        HighsInt iRow = indirection[index[iEl]];
        if (iRow < num_upper_bound_row) {
          HighsInt extra_columns_iEl = count[iRow];
          assert(extra_columns_iEl < extra_columns_num_nz);
          extra_columns.index_[extra_columns_iEl] = iCol;
          extra_columns.value_[extra_columns_iEl] = value[iEl];
          count[iRow]++;
        }
      }
    }
    extra_columns.num_col_ += num_upper_bound_row;
  }
  // Incorporate the cost shift by subtracting A*primal_bound from the
  // cost vector; compute the objective offset
  double delta_offset = 0;
  for (size_t iX = 0; iX < primal_bound_index.size(); iX++) {
    HighsInt iCol = primal_bound_index[iX];
    double multiplier = primal_bound_value[iX];
    delta_offset += multiplier * original_col_cost_[iCol];
    for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
      lp_.col_cost_[index[iEl]] -= multiplier * value[iEl];
  }
  if (extra_columns.num_col_) {
    // Incorporate the cost shift by subtracting
    // extra_columns*primal_bound from the cost vector for the extra
    // dual variables
    //
    // Have to scatter the packed primal bound values into a
    // full-length vector
    //
    // ToDo Make this more efficient?
    vector<double> primal_bound;
    primal_bound.assign(original_num_col_, 0);
    for (size_t iX = 0; iX < primal_bound_index.size(); iX++)
      primal_bound[primal_bound_index[iX]] = primal_bound_value[iX];

    for (HighsInt iCol = 0; iCol < extra_columns.num_col_; iCol++) {
      double cost = lp_.col_cost_[original_num_row_ + iCol];
      for (HighsInt iEl = extra_columns.start_[iCol];
           iEl < extra_columns.start_[iCol + 1]; iEl++)
        cost -=
            primal_bound[extra_columns.index_[iEl]] * extra_columns.value_[iEl];
      lp_.col_cost_[original_num_row_ + iCol] = cost;
    }
  }
  lp_.offset_ += delta_offset;
  // Copy the row-wise dual LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = dual_matrix;
  lp_.a_matrix_.ensureColwise();
  // Add the extra columns to the dual LP constraint matrix
  lp_.a_matrix_.addCols(extra_columns);

  HighsInt dual_num_col =
      original_num_row_ + num_upper_bound_col + num_upper_bound_row;
  HighsInt dual_num_row = original_num_col_;
  assert(dual_num_col == (int)lp_.col_cost_.size());
  assert(lp_.a_matrix_.num_col_ == dual_num_col);
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.num_col = dual_num_col;
      lp_.scale_.num_row = dual_num_row;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = dual_num_col;
  lp_.num_row_ = dual_num_row;
  status_.is_dualized = true;
  status_.has_basis = false;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving dual LP with %d columns", (int)dual_num_col);
  if (num_upper_bound_col + num_upper_bound_row) {
    highsLogUser(options_->log_options, HighsLogType::kInfo, " [%d extra from",
                 (int)dual_num_col - original_num_row_);
    if (num_upper_bound_col)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed variable(s)", (int)num_upper_bound_col);
    if (num_upper_bound_col && num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo, " and");
    if (num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed constraint(s)", (int)num_upper_bound_row);
    highsLogUser(options_->log_options, HighsLogType::kInfo, "]");
  }
  highsLogUser(options_->log_options, HighsLogType::kInfo, " and %d rows\n",
               (int)dual_num_row);
  //  reportLp(options_->log_options, lp_, HighsLogType::kVerbose);
  return HighsStatus::kOk;
}